

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regparse.c
# Opt level: O3

int prs_branch(Node **top,PToken *tok,int term,OnigUChar **src,OnigUChar *end,ParseEnv *env,
              int group_head)

{
  _Node *p_Var1;
  uint uVar2;
  int iVar3;
  Node *pNVar4;
  _Node *p_Var5;
  Node *node;
  Node *local_50;
  PToken *local_48;
  OnigUChar **local_40;
  OnigUChar *local_38;
  
  *top = (Node *)0x0;
  uVar2 = env->parse_depth + 1;
  env->parse_depth = uVar2;
  iVar3 = -0x10;
  if (uVar2 <= ParseDepthLimit) {
    local_48 = tok;
    iVar3 = prs_exp(&local_50,tok,term,src,end,env,group_head);
    node = local_50;
    if (iVar3 < 0) {
      if (local_50 != (Node *)0x0) {
        node_free_body(local_50);
        free(local_50);
      }
    }
    else {
      if ((iVar3 == 0) || (iVar3 == term || iVar3 == 0xd)) {
        *top = local_50;
      }
      else {
        local_40 = src;
        local_38 = end;
        pNVar4 = (Node *)calloc(1,0x48);
        if (pNVar4 == (Node *)0x0) {
          *top = (Node *)0x0;
          if (node != (Node *)0x0) {
LAB_0011387f:
            node_free_body(node);
            free(node);
          }
          return -5;
        }
        (pNVar4->u).base.node_type = ND_LIST;
        (pNVar4->u).base.body = node;
        *top = pNVar4;
        do {
          if ((iVar3 == term) || (iVar3 == 0xd)) goto LAB_00113757;
          iVar3 = prs_exp(&local_50,local_48,term,local_40,local_38,env,0);
          node = local_50;
          if (iVar3 < 0) {
            onig_node_free(local_50);
            return iVar3;
          }
          if ((local_50->u).base.node_type == ND_LIST) {
            (pNVar4->u).cons.cdr = local_50;
            p_Var1 = local_50;
            do {
              p_Var5 = p_Var1;
              p_Var1 = (p_Var5->u).cons.cdr;
              local_50 = p_Var5;
            } while (p_Var1 != (_Node *)0x0);
          }
          else {
            p_Var5 = (_Node *)calloc(1,0x48);
            if (p_Var5 == (_Node *)0x0) {
              (pNVar4->u).str.end = (OnigUChar *)0x0;
              goto LAB_0011387f;
            }
            (p_Var5->u).base.node_type = ND_LIST;
            (p_Var5->u).base.body = node;
            (p_Var5->u).str.end = (OnigUChar *)0x0;
            (pNVar4->u).cons.cdr = p_Var5;
          }
          pNVar4 = p_Var5;
        } while (iVar3 != 0);
        iVar3 = 0;
      }
LAB_00113757:
      env->parse_depth = env->parse_depth - 1;
    }
  }
  return iVar3;
}

Assistant:

static int
prs_branch(Node** top, PToken* tok, int term, UChar** src, UChar* end,
           ParseEnv* env, int group_head)
{
  int r;
  Node *node, **headp;

  *top = NULL;
  INC_PARSE_DEPTH(env->parse_depth);

  r = prs_exp(&node, tok, term, src, end, env, group_head);
  if (r < 0) {
    onig_node_free(node);
    return r;
  }

  if (r == TK_EOT || r == term || r == TK_ALT) {
    *top = node;
  }
  else {
    *top = node_new_list(node, NULL);
    if (IS_NULL(*top)) {
    mem_err:
      onig_node_free(node);
      return ONIGERR_MEMORY;
    }

    headp = &(ND_CDR(*top));
    while (r != TK_EOT && r != term && r != TK_ALT) {
      r = prs_exp(&node, tok, term, src, end, env, FALSE);
      if (r < 0) {
        onig_node_free(node);
        return r;
      }

      if (ND_TYPE(node) == ND_LIST) {
        *headp = node;
        while (IS_NOT_NULL(ND_CDR(node))) node = ND_CDR(node);
        headp = &(ND_CDR(node));
      }
      else {
        *headp = node_new_list(node, NULL);
        if (IS_NULL(*headp)) goto mem_err;
        headp = &(ND_CDR(*headp));
      }
    }
  }

  DEC_PARSE_DEPTH(env->parse_depth);
  return r;
}